

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O2

int zt_threads_set_cond_callbacks(zt_threads_cond_callbacks *cbs)

{
  if (cbs == (zt_threads_cond_callbacks *)0x0) {
    _zt_threads_cond_cbs.alloc._0_4_ = 0;
    _zt_threads_cond_cbs.alloc._4_4_ = 0;
    _zt_threads_cond_cbs.free._0_4_ = 0;
    _zt_threads_cond_cbs.free._4_4_ = 0;
    _zt_threads_cond_cbs.signal = (_func_int_zt_threads_cond_ptr_int *)0x0;
    _zt_threads_cond_cbs.wait =
         (_func_int_zt_threads_cond_ptr_zt_threads_mutex_ptr_timeval_ptr *)0x0;
  }
  else {
    if (cbs->alloc == (_func_zt_threads_cond_ptr_int *)0x0) {
      return -1;
    }
    if (cbs->free == (_func_void_zt_threads_cond_ptr *)0x0) {
      return -1;
    }
    if (cbs->signal == (_func_int_zt_threads_cond_ptr_int *)0x0) {
      return -1;
    }
    if (cbs->wait == (_func_int_zt_threads_cond_ptr_zt_threads_mutex_ptr_timeval_ptr *)0x0) {
      return -1;
    }
    _zt_threads_cond_cbs.alloc._0_4_ = *(undefined4 *)&cbs->alloc;
    _zt_threads_cond_cbs.alloc._4_4_ = *(undefined4 *)((long)&cbs->alloc + 4);
    _zt_threads_cond_cbs.free._0_4_ = *(undefined4 *)&cbs->free;
    _zt_threads_cond_cbs.free._4_4_ = *(undefined4 *)((long)&cbs->free + 4);
    _zt_threads_cond_cbs.signal = cbs->signal;
    _zt_threads_cond_cbs.wait = cbs->wait;
  }
  return 0;
}

Assistant:

int
zt_threads_set_cond_callbacks(struct zt_threads_cond_callbacks *cbs) {
    struct zt_threads_cond_callbacks *t = &_zt_threads_cond_cbs;

    if (cbs == NULL) {
        memset(t, 0, sizeof(_zt_threads_cond_cbs));
        return 0;
    }

    if (cbs->alloc && cbs->free && cbs->signal && cbs->wait) {
        memcpy(t, cbs, sizeof(_zt_threads_cond_cbs));
        return 0;
    }

    return -1;
}